

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx512::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::ObjectIntersectorK<4,_false>_>,_false>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar1;
  undefined4 uVar2;
  uint uVar3;
  size_t sVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  undefined8 uVar8;
  NodeRef nodeRef;
  RTCIntersectFunctionN p_Var9;
  byte bVar10;
  byte bVar11;
  NodeRef *pNVar12;
  size_t sVar13;
  byte bVar14;
  uint i;
  long lVar15;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar16;
  size_t sVar17;
  ulong uVar18;
  bool bVar19;
  byte bVar20;
  ulong uVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  vint4 ai_2;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar30;
  undefined1 auVar31 [64];
  vint4 ai;
  undefined1 in_ZMM2 [64];
  vint4 ai_1;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  vint4 ai_3;
  undefined1 auVar34 [16];
  vint4 bi;
  undefined1 auVar35 [16];
  vint4 bi_1;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  vint4 bi_3;
  undefined1 auVar38 [16];
  vint4 bi_2;
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  RTCIntersectFunctionNArguments local_17b0;
  Geometry *local_1780;
  undefined8 local_1778;
  RTCIntersectArguments *local_1770;
  undefined1 local_1768 [16];
  undefined1 local_1758 [16];
  undefined1 local_1748 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_1738;
  undefined1 local_1728 [16];
  undefined1 local_1718 [16];
  undefined1 local_1708 [16];
  undefined1 local_16f8 [16];
  vint<4> mask;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  sVar17 = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (sVar17 != 8) {
    if ((context->user != (RTCRayQueryContext *)0x0) &&
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) != RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      occludedCoherent(valid_i,This,ray,context);
      return;
    }
    auVar26 = vpcmpeqd_avx(in_ZMM2._0_16_,in_ZMM2._0_16_);
    uVar8 = vcmpps_avx512vl(*(undefined1 (*) [16])(ray + 0x80),ZEXT816(0) << 0x40,5);
    uVar21 = vpcmpeqd_avx512vl(auVar26,(undefined1  [16])valid_i->field_0);
    uVar21 = ((byte)uVar8 & 0xf) & uVar21;
    bVar20 = (byte)uVar21;
    if (bVar20 != 0) {
      auVar26 = *(undefined1 (*) [16])(ray + 0x40);
      auVar27 = *(undefined1 (*) [16])(ray + 0x50);
      auVar29 = *(undefined1 (*) [16])(ray + 0x60);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      auVar42 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      auVar22 = vmaxps_avx512vl(*(undefined1 (*) [16])(ray + 0x30),ZEXT816(0) << 0x40);
      local_1738._0_4_ = (uint)(bVar20 & 1) * auVar22._0_4_ | (uint)!(bool)(bVar20 & 1) * 0x7f800000
      ;
      bVar19 = (bool)((byte)(uVar21 >> 1) & 1);
      local_1738._4_4_ = (uint)bVar19 * auVar22._4_4_ | (uint)!bVar19 * 0x7f800000;
      bVar19 = (bool)((byte)(uVar21 >> 2) & 1);
      local_1738._8_4_ = (uint)bVar19 * auVar22._8_4_ | (uint)!bVar19 * 0x7f800000;
      bVar19 = SUB81(uVar21 >> 3,0);
      local_1738._12_4_ = (uint)bVar19 * auVar22._12_4_ | (uint)!bVar19 * 0x7f800000;
      auVar43 = ZEXT1664((undefined1  [16])local_1738);
      auVar22 = *(undefined1 (*) [16])(ray + 0x10);
      auVar24 = *(undefined1 (*) [16])(ray + 0x20);
      auVar32._0_8_ = auVar24._0_8_ ^ 0x8000000080000000;
      auVar32._8_4_ = auVar24._8_4_ ^ 0x80000000;
      auVar32._12_4_ = auVar24._12_4_ ^ 0x80000000;
      bVar11 = (byte)((ushort)((short)uVar21 << 0xc) >> 0xc) ^ 0xf;
      stack_node[0].ptr = 0xfffffffffffffff8;
      stack_node[1].ptr = sVar17;
      stack_near[1].field_0 = local_1738;
      if (sVar17 != 0xfffffffffffffff8) {
        auVar23._8_4_ = 0x7fffffff;
        auVar23._0_8_ = 0x7fffffff7fffffff;
        auVar23._12_4_ = 0x7fffffff;
        auVar24 = vandps_avx(auVar26,auVar23);
        auVar36._8_4_ = 0x219392ef;
        auVar36._0_8_ = 0x219392ef219392ef;
        auVar36._12_4_ = 0x219392ef;
        uVar18 = vcmpps_avx512vl(auVar24,auVar36,1);
        bVar19 = (bool)((byte)uVar18 & 1);
        auVar24._0_4_ = (uint)bVar19 * 0x219392ef | (uint)!bVar19 * auVar26._0_4_;
        bVar19 = (bool)((byte)(uVar18 >> 1) & 1);
        auVar24._4_4_ = (uint)bVar19 * 0x219392ef | (uint)!bVar19 * auVar26._4_4_;
        bVar19 = (bool)((byte)(uVar18 >> 2) & 1);
        auVar24._8_4_ = (uint)bVar19 * 0x219392ef | (uint)!bVar19 * auVar26._8_4_;
        bVar19 = (bool)((byte)(uVar18 >> 3) & 1);
        auVar24._12_4_ = (uint)bVar19 * 0x219392ef | (uint)!bVar19 * auVar26._12_4_;
        auVar26 = vandps_avx(auVar27,auVar23);
        uVar18 = vcmpps_avx512vl(auVar26,auVar36,1);
        bVar19 = (bool)((byte)uVar18 & 1);
        auVar25._0_4_ = (uint)bVar19 * 0x219392ef | (uint)!bVar19 * auVar27._0_4_;
        bVar19 = (bool)((byte)(uVar18 >> 1) & 1);
        auVar25._4_4_ = (uint)bVar19 * 0x219392ef | (uint)!bVar19 * auVar27._4_4_;
        bVar19 = (bool)((byte)(uVar18 >> 2) & 1);
        auVar25._8_4_ = (uint)bVar19 * 0x219392ef | (uint)!bVar19 * auVar27._8_4_;
        bVar19 = (bool)((byte)(uVar18 >> 3) & 1);
        auVar25._12_4_ = (uint)bVar19 * 0x219392ef | (uint)!bVar19 * auVar27._12_4_;
        auVar26 = vandps_avx(auVar29,auVar23);
        uVar18 = vcmpps_avx512vl(auVar26,auVar36,1);
        bVar19 = (bool)((byte)uVar18 & 1);
        auVar28._0_4_ = (uint)bVar19 * 0x219392ef | (uint)!bVar19 * auVar29._0_4_;
        bVar19 = (bool)((byte)(uVar18 >> 1) & 1);
        auVar28._4_4_ = (uint)bVar19 * 0x219392ef | (uint)!bVar19 * auVar29._4_4_;
        bVar19 = (bool)((byte)(uVar18 >> 2) & 1);
        auVar28._8_4_ = (uint)bVar19 * 0x219392ef | (uint)!bVar19 * auVar29._8_4_;
        bVar19 = (bool)((byte)(uVar18 >> 3) & 1);
        auVar28._12_4_ = (uint)bVar19 * 0x219392ef | (uint)!bVar19 * auVar29._12_4_;
        auVar23 = vrcp14ps_avx512vl(auVar24);
        auVar29._8_4_ = 0x3f800000;
        auVar29._0_8_ = 0x3f8000003f800000;
        auVar29._12_4_ = 0x3f800000;
        auVar26 = vfnmadd213ps_fma(auVar24,auVar23,auVar29);
        auVar24 = vrcp14ps_avx512vl(auVar25);
        auVar27 = vfnmadd213ps_fma(auVar25,auVar24,auVar29);
        auVar25 = vrcp14ps_avx512vl(auVar28);
        auVar29 = vfnmadd213ps_fma(auVar28,auVar25,auVar29);
        local_1718 = vfmadd132ps_fma(auVar27,auVar24,auVar24);
        auVar40 = ZEXT1664(local_1718);
        local_1708 = vfmadd132ps_fma(auVar26,auVar23,auVar23);
        auVar39 = ZEXT1664(local_1708);
        local_1728 = vfmadd132ps_fma(auVar29,auVar25,auVar25);
        auVar41 = ZEXT1664(local_1728);
        pNVar12 = stack_node + 1;
        local_1748._0_4_ = local_1708._0_4_ * -*(float *)ray;
        local_1748._4_4_ = local_1708._4_4_ * -*(float *)(ray + 4);
        local_1748._8_4_ = local_1708._8_4_ * -*(float *)(ray + 8);
        local_1748._12_4_ = local_1708._12_4_ * -*(float *)(ray + 0xc);
        auVar44 = ZEXT1664(local_1748);
        local_1758._0_4_ = local_1718._0_4_ * -auVar22._0_4_;
        local_1758._4_4_ = local_1718._4_4_ * -auVar22._4_4_;
        local_1758._8_4_ = local_1718._8_4_ * -auVar22._8_4_;
        local_1758._12_4_ = local_1718._12_4_ * -auVar22._12_4_;
        auVar45 = ZEXT1664(local_1758);
        local_1768 = vmulps_avx512vl(local_1728,auVar32);
        auVar46 = ZEXT1664(local_1768);
        auVar26 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar27 = vmaxps_avx512vl(*(undefined1 (*) [16])(ray + 0x80),ZEXT816(0) << 0x20);
        bVar19 = (bool)((byte)(uVar21 >> 1) & 1);
        bVar5 = (bool)((byte)(uVar21 >> 2) & 1);
        bVar6 = SUB81(uVar21 >> 3,0);
        auVar47 = ZEXT1664(CONCAT412((uint)bVar6 * auVar27._12_4_ | (uint)!bVar6 * auVar26._12_4_,
                                     CONCAT48((uint)bVar5 * auVar27._8_4_ |
                                              (uint)!bVar5 * auVar26._8_4_,
                                              CONCAT44((uint)bVar19 * auVar27._4_4_ |
                                                       (uint)!bVar19 * auVar26._4_4_,
                                                       (uint)(bVar20 & 1) * auVar27._0_4_ |
                                                       (uint)!(bool)(bVar20 & 1) * auVar26._0_4_))))
        ;
        paVar16 = &stack_near[2].field_0;
LAB_006ae472:
        do {
          paVar1 = paVar16 + -1;
          auVar31 = ZEXT1664((undefined1  [16])*paVar1);
          paVar16 = paVar16 + -1;
          auVar26 = auVar47._0_16_;
          uVar8 = vcmpps_avx512vl((undefined1  [16])*paVar1,auVar26,1);
          if ((char)uVar8 != '\0') {
LAB_006ae48e:
            if ((sVar17 & 8) == 0) goto code_r0x006ae498;
            if (sVar17 == 0xfffffffffffffff8) break;
            uVar8 = vcmpps_avx512vl(auVar26,auVar31._0_16_,6);
            if ((char)uVar8 != '\0') {
              uVar21 = (ulong)((uint)sVar17 & 0xf);
              bVar10 = bVar11;
              if (uVar21 != 8) {
                bVar10 = bVar11 ^ 0xf;
                uVar18 = 1;
                local_16f8 = auVar26;
                do {
                  local_17b0.geomID = *(uint *)(((sVar17 & 0xfffffffffffffff0) - 8) + uVar18 * 8);
                  local_1780 = (context->scene->geometries).items[local_17b0.geomID].ptr;
                  uVar3 = local_1780->mask;
                  auVar26._4_4_ = uVar3;
                  auVar26._0_4_ = uVar3;
                  auVar26._8_4_ = uVar3;
                  auVar26._12_4_ = uVar3;
                  uVar8 = vptestmd_avx512vl(auVar26,*(undefined1 (*) [16])(ray + 0x90));
                  bVar14 = (byte)uVar8 & 0xf & bVar10;
                  if (bVar14 == 0) {
                    bVar14 = 0xf;
                  }
                  else {
                    local_17b0.primID = *(uint *)(((sVar17 & 0xfffffffffffffff0) - 4) + uVar18 * 8);
                    mask.field_0 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                                   vpmovm2d_avx512vl((ulong)bVar14);
                    local_17b0.valid = (int *)&mask;
                    local_17b0.geometryUserPtr = local_1780->userPtr;
                    local_17b0.context = context->user;
                    local_17b0.N = 4;
                    local_1778 = 0;
                    local_1770 = context->args;
                    p_Var9 = local_1770->intersect;
                    if (p_Var9 == (RTCIntersectFunctionN)0x0) {
                      p_Var9 = (RTCIntersectFunctionN)
                               local_1780[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i;
                    }
                    local_17b0.rayhit = (RTCRayHitN *)ray;
                    (*p_Var9)(&local_17b0);
                    uVar8 = vcmpps_avx512vl((undefined1  [16])0x0,*(undefined1 (*) [16])(ray + 0x80)
                                            ,0xe);
                    bVar14 = (byte)uVar8 ^ 0xf;
                    auVar39 = ZEXT1664(local_1708);
                    auVar40 = ZEXT1664(local_1718);
                    auVar41 = ZEXT1664(local_1728);
                    auVar42 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000))
                                      );
                    auVar43 = ZEXT1664((undefined1  [16])local_1738);
                    auVar44 = ZEXT1664(local_1748);
                    auVar45 = ZEXT1664(local_1758);
                    auVar46 = ZEXT1664(local_1768);
                    auVar47 = ZEXT1664(local_16f8);
                  }
                  auVar26 = auVar47._0_16_;
                  bVar10 = bVar10 & bVar14;
                } while ((bVar10 != 0) &&
                        (bVar19 = uVar18 < uVar21 - 8, uVar18 = uVar18 + 1, bVar19));
                bVar10 = bVar10 ^ 0xf;
              }
              bVar11 = bVar10 | bVar11;
              if (bVar11 != 0xf) {
                auVar27 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                bVar19 = (bool)(bVar11 >> 1 & 1);
                bVar5 = (bool)(bVar11 >> 2 & 1);
                auVar47 = ZEXT1664(CONCAT412((uint)(bVar11 >> 3) * auVar27._12_4_ |
                                             (uint)!(bool)(bVar11 >> 3) * auVar26._12_4_,
                                             CONCAT48((uint)bVar5 * auVar27._8_4_ |
                                                      (uint)!bVar5 * auVar26._8_4_,
                                                      CONCAT44((uint)bVar19 * auVar27._4_4_ |
                                                               (uint)!bVar19 * auVar26._4_4_,
                                                               (uint)(bVar11 & 1) * auVar27._0_4_ |
                                                               (uint)!(bool)(bVar11 & 1) *
                                                               auVar26._0_4_))));
                goto LAB_006ae746;
              }
              bVar11 = 0xf;
              break;
            }
          }
LAB_006ae746:
          sVar17 = pNVar12[-1].ptr;
          pNVar12 = pNVar12 + -1;
        } while (sVar17 != 0xfffffffffffffff8);
      }
LAB_006ae769:
      bVar11 = bVar11 & bVar20;
      bVar19 = (bool)(bVar11 >> 1 & 1);
      bVar5 = (bool)(bVar11 >> 2 & 1);
      *(uint *)(ray + 0x80) =
           (uint)(bVar11 & 1) * -0x800000 | (uint)!(bool)(bVar11 & 1) * *(int *)(ray + 0x80);
      *(uint *)(ray + 0x84) = (uint)bVar19 * -0x800000 | (uint)!bVar19 * *(int *)(ray + 0x84);
      *(uint *)(ray + 0x88) = (uint)bVar5 * -0x800000 | (uint)!bVar5 * *(int *)(ray + 0x88);
      *(uint *)(ray + 0x8c) =
           (uint)(bVar11 >> 3) * -0x800000 | (uint)!(bool)(bVar11 >> 3) * *(int *)(ray + 0x8c);
    }
  }
  return;
code_r0x006ae498:
  lVar15 = 0;
  sVar13 = 8;
  aVar30 = auVar42._0_16_;
  do {
    sVar4 = *(size_t *)((sVar17 & 0xfffffffffffffff0) + lVar15 * 8);
    if (sVar4 == 8) {
      auVar31 = ZEXT1664((undefined1  [16])aVar30);
      break;
    }
    uVar2 = *(undefined4 *)(sVar17 + 0x20 + lVar15 * 4);
    auVar27._4_4_ = uVar2;
    auVar27._0_4_ = uVar2;
    auVar27._8_4_ = uVar2;
    auVar27._12_4_ = uVar2;
    auVar22 = vfmadd132ps_fma(auVar27,auVar44._0_16_,auVar39._0_16_);
    uVar2 = *(undefined4 *)(sVar17 + 0x40 + lVar15 * 4);
    auVar33._4_4_ = uVar2;
    auVar33._0_4_ = uVar2;
    auVar33._8_4_ = uVar2;
    auVar33._12_4_ = uVar2;
    auVar24 = vfmadd132ps_fma(auVar33,auVar45._0_16_,auVar40._0_16_);
    uVar2 = *(undefined4 *)(sVar17 + 0x60 + lVar15 * 4);
    auVar34._4_4_ = uVar2;
    auVar34._0_4_ = uVar2;
    auVar34._8_4_ = uVar2;
    auVar34._12_4_ = uVar2;
    auVar28 = vfmadd132ps_avx512vl(auVar34,auVar46._0_16_,auVar41._0_16_);
    uVar2 = *(undefined4 *)(sVar17 + 0x30 + lVar15 * 4);
    auVar35._4_4_ = uVar2;
    auVar35._0_4_ = uVar2;
    auVar35._8_4_ = uVar2;
    auVar35._12_4_ = uVar2;
    auVar32 = vfmadd132ps_fma(auVar35,auVar44._0_16_,auVar39._0_16_);
    uVar2 = *(undefined4 *)(sVar17 + 0x50 + lVar15 * 4);
    auVar37._4_4_ = uVar2;
    auVar37._0_4_ = uVar2;
    auVar37._8_4_ = uVar2;
    auVar37._12_4_ = uVar2;
    auVar25 = vfmadd132ps_fma(auVar37,auVar45._0_16_,auVar40._0_16_);
    uVar2 = *(undefined4 *)(sVar17 + 0x70 + lVar15 * 4);
    auVar38._4_4_ = uVar2;
    auVar38._0_4_ = uVar2;
    auVar38._8_4_ = uVar2;
    auVar38._12_4_ = uVar2;
    auVar23 = vfmadd132ps_avx512vl(auVar38,auVar46._0_16_,auVar41._0_16_);
    auVar27 = vpminsd_avx(auVar22,auVar32);
    auVar29 = vpminsd_avx(auVar24,auVar25);
    auVar27 = vpmaxsd_avx(auVar27,auVar29);
    auVar29 = vpminsd_avx(auVar28,auVar23);
    auVar27 = vpmaxsd_avx(auVar27,auVar29);
    auVar29 = vpmaxsd_avx(auVar22,auVar32);
    auVar22 = vpmaxsd_avx(auVar24,auVar25);
    auVar24 = vpminsd_avx(auVar29,auVar22);
    auVar29 = vpmaxsd_avx(auVar28,auVar23);
    auVar22 = vpmaxsd_avx(auVar27,auVar43._0_16_);
    auVar29 = vpminsd_avx512vl(auVar29,auVar26);
    auVar29 = vpminsd_avx(auVar24,auVar29);
    uVar21 = vpcmpd_avx512vl(auVar22,auVar29,2);
    uVar21 = uVar21 & 0xf;
    if ((byte)uVar21 == 0) {
      auVar31 = ZEXT1664((undefined1  [16])aVar30);
      sVar4 = sVar13;
    }
    else {
      auVar29 = vblendmps_avx512vl((undefined1  [16])auVar42._0_16_,auVar27);
      bVar19 = (bool)((byte)uVar21 & 1);
      bVar5 = (bool)((byte)(uVar21 >> 1) & 1);
      bVar6 = (bool)((byte)(uVar21 >> 2) & 1);
      bVar7 = SUB81(uVar21 >> 3,0);
      auVar31 = ZEXT1664(CONCAT412((uint)bVar7 * auVar29._12_4_ | (uint)!bVar7 * auVar27._12_4_,
                                   CONCAT48((uint)bVar6 * auVar29._8_4_ |
                                            (uint)!bVar6 * auVar27._8_4_,
                                            CONCAT44((uint)bVar5 * auVar29._4_4_ |
                                                     (uint)!bVar5 * auVar27._4_4_,
                                                     (uint)bVar19 * auVar29._0_4_ |
                                                     (uint)!bVar19 * auVar27._0_4_))));
      if (sVar13 != 8) {
        pNVar12->ptr = sVar13;
        pNVar12 = pNVar12 + 1;
        *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar16->v = aVar30;
        paVar16 = paVar16 + 1;
      }
    }
    sVar13 = sVar4;
    lVar15 = lVar15 + 1;
    aVar30 = auVar31._0_16_;
  } while (lVar15 != 4);
  sVar17 = sVar13;
  if (sVar13 == 8) goto code_r0x006ae59c;
  goto LAB_006ae48e;
code_r0x006ae59c:
  sVar17 = pNVar12[-1].ptr;
  pNVar12 = pNVar12 + -1;
  if (sVar17 == 0xfffffffffffffff8) goto LAB_006ae769;
  goto LAB_006ae472;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }